

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_utils.cpp
# Opt level: O1

void __thiscall icu_63::number::impl::DecNum::setTo(DecNum *this,double d,UErrorCode *status)

{
  int32_t *piVar1;
  uint8_t *puVar2;
  decNumber *pdVar3;
  undefined1 auVar4 [16];
  int iVar5;
  undefined8 in_XMM0_Qb;
  bool sign;
  int32_t point;
  int32_t length;
  char buffer [23];
  bool local_61;
  int local_60;
  int32_t local_5c;
  double local_58;
  undefined8 uStack_50;
  char local_48 [32];
  
  if ((ulong)ABS(d) < 0x7ff0000000000000) {
    local_58 = d;
    uStack_50 = in_XMM0_Qb;
    double_conversion::DoubleToStringConverter::DoubleToAscii
              (d,SHORTEST,0,local_48,0x17,&local_61,&local_5c,&local_60);
    _setTo(this,local_48,local_5c,status);
    pdVar3 = (this->fData).ptr;
    piVar1 = &pdVar3->exponent;
    *piVar1 = *piVar1 + (local_60 - local_5c);
    auVar4._8_8_ = uStack_50;
    auVar4._0_8_ = local_58;
    iVar5 = movmskpd(local_60 - local_5c,auVar4);
    puVar2 = &pdVar3->bits;
    *puVar2 = *puVar2 | (byte)(iVar5 << 7);
  }
  else {
    *status = U_UNSUPPORTED_ERROR;
  }
  return;
}

Assistant:

void DecNum::setTo(double d, UErrorCode& status) {
    // Need to check for NaN and Infinity before going into DoubleToStringConverter
    if (std::isnan(d) != 0 || std::isfinite(d) == 0) {
        status = U_UNSUPPORTED_ERROR;
        return;
    }

    // First convert from double to string, then string to DecNum.
    // Allocate enough room for: all digits, "E-324", and NUL-terminator.
    char buffer[DoubleToStringConverter::kBase10MaximalLength + 6];
    bool sign; // unused; always positive
    int32_t length;
    int32_t point;
    DoubleToStringConverter::DoubleToAscii(
            d,
            DoubleToStringConverter::DtoaMode::SHORTEST,
            0,
            buffer,
            sizeof(buffer),
            &sign,
            &length,
            &point
    );

    // Read initial result as a string.
    _setTo(buffer, length, status);

    // Set exponent and bitmask. Note that DoubleToStringConverter does not do negatives.
    fData.getAlias()->exponent += point - length;
    fData.getAlias()->bits |= static_cast<uint8_t>(std::signbit(d) ? DECNEG : 0);
}